

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void color_tree_cleanup(ColorTree *tree)

{
  long in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 != 0x10; iVar1 = iVar1 + 1) {
    if (*(long *)(in_RDI + (long)iVar1 * 8) != 0) {
      color_tree_cleanup((ColorTree *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
      lodepng_free((void *)0x6774bf);
    }
  }
  return;
}

Assistant:

static void color_tree_cleanup(ColorTree* tree)
{
  int i;
  for(i = 0; i != 16; ++i)
  {
    if(tree->children[i])
    {
      color_tree_cleanup(tree->children[i]);
      lodepng_free(tree->children[i]);
    }
  }
}